

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

void __thiscall
ON_Internal_ExtrudedEdge::SetBothEdgeTags(ON_Internal_ExtrudedEdge *this,ON_SubDEdgeTag edge_tag)

{
  ON_Internal_ExtrudedVertex *pOVar1;
  ON_SubDEdge *pOVar2;
  uint evi;
  long lVar3;
  ON_SubDEdgeTag OVar4;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,edge_tag) == 2) {
    if (this->m_original_edge != (ON_SubDEdge *)0x0) {
      this->m_original_edge->m_edge_tag = Crease;
    }
    if (this->m_copied_edge != (ON_SubDEdge *)0x0) {
      this->m_copied_edge->m_edge_tag = Crease;
    }
    lVar3 = 0;
    do {
      pOVar1 = this->m_extruded_vertex[lVar3];
      if ((pOVar1 != (ON_Internal_ExtrudedVertex *)0x0) &&
         (pOVar2 = pOVar1->m_connecting_edge, pOVar2->m_edge_tag == Unset)) {
        if (pOVar1->m_initial_vertex_tag == Corner) {
          if (pOVar1->m_original_vertex != (ON_SubDVertex *)0x0) {
            pOVar1->m_original_vertex->m_vertex_tag = Corner;
          }
          if (pOVar1->m_copied_vertex != (ON_SubDVertex *)0x0) {
            pOVar1->m_copied_vertex->m_vertex_tag = Corner;
          }
          OVar4 = Crease;
        }
        else {
          OVar4 = Smooth;
        }
        if (pOVar2 != (ON_SubDEdge *)0x0) {
          pOVar2->m_edge_tag = OVar4;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
  }
  return;
}

Assistant:

void SetBothEdgeTags(ON_SubDEdgeTag edge_tag)
  {
    if (ON_SubDEdgeTag::Crease == edge_tag)
    {
      if (nullptr != m_original_edge)
        m_original_edge->m_edge_tag = ON_SubDEdgeTag::Crease;
      if (nullptr != m_copied_edge)
        m_copied_edge->m_edge_tag = ON_SubDEdgeTag::Crease;
      for (unsigned evi = 0; evi < 2; ++evi)
      {
        if (nullptr != m_extruded_vertex[evi] && ON_SubDEdgeTag::Unset == m_extruded_vertex[evi]->m_connecting_edge->m_edge_tag)
        {
          if (ON_SubDVertexTag::Corner == m_extruded_vertex[evi]->m_initial_vertex_tag)
            m_extruded_vertex[evi]->SetBothVertexTags(ON_SubDVertexTag::Corner);
          else if (nullptr != m_extruded_vertex[evi]->m_connecting_edge)
            m_extruded_vertex[evi]->m_connecting_edge->m_edge_tag = ON_SubDEdgeTag::Smooth;
        }
      }
    }
  }